

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellABecLap.cpp
# Opt level: O0

void __thiscall
amrex::MLCellABecLap::getFluxes
          (MLCellABecLap *this,
          Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
          *a_flux,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a_sol,
          Location a_loc)

{
  int iVar1;
  array<amrex::MultiFab_*,_3UL> *paVar2;
  MultiFab **ppMVar3;
  const_reference ppMVar4;
  uint in_ECX;
  MLCellLinOp *in_RDI;
  double extraout_XMM0_Qa;
  int idim;
  int alev;
  int nlevs;
  Real betainv;
  Real in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb0;
  uint uVar5;
  int local_34;
  uint local_30;
  
  (*(in_RDI->super_MLLinOp)._vptr_MLLinOp[0x4c])();
  iVar1 = MLLinOp::NAMRLevels(&in_RDI->super_MLLinOp);
  for (local_30 = 0; (int)local_30 < iVar1; local_30 = local_30 + 1) {
    uVar5 = local_30;
    paVar2 = Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
             ::operator[]((Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                           *)CONCAT44(local_30,in_stack_ffffffffffffffb0),
                          (size_type)in_stack_ffffffffffffffa8);
    ppMVar3 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                        ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                         CONCAT44(uVar5,in_stack_ffffffffffffffb0),
                         (size_type)in_stack_ffffffffffffffa8);
    (*(in_RDI->super_MLLinOp)._vptr_MLLinOp[0x13])
              (in_RDI,(ulong)uVar5,paVar2,*ppMVar3,(ulong)in_ECX);
    for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
      in_stack_ffffffffffffffb0 = local_30;
      Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
      ::operator[]((Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                    *)CONCAT44(uVar5,local_30),(size_type)in_stack_ffffffffffffffa8);
      ppMVar4 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                          ((array<amrex::MultiFab_*,_3UL> *)
                           CONCAT44(uVar5,in_stack_ffffffffffffffb0),
                           (size_type)in_stack_ffffffffffffffa8);
      MLCellLinOp::unapplyMetricTerm(in_RDI,in_stack_ffffffffffffffb0,0,*ppMVar4);
      if ((1.0 / extraout_XMM0_Qa != 1.0) || (NAN(1.0 / extraout_XMM0_Qa))) {
        Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
        ::operator[]((Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
                      *)CONCAT44(uVar5,in_stack_ffffffffffffffb0),
                     (size_type)in_stack_ffffffffffffffa8);
        std::array<amrex::MultiFab_*,_3UL>::operator[]
                  ((array<amrex::MultiFab_*,_3UL> *)CONCAT44(uVar5,in_stack_ffffffffffffffb0),
                   (size_type)in_stack_ffffffffffffffa8);
        MultiFab::mult((MultiFab *)CONCAT44(uVar5,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8,0);
      }
    }
  }
  return;
}

Assistant:

void
MLCellABecLap::getFluxes (const Vector<Array<MultiFab*,AMREX_SPACEDIM> >& a_flux,
                          const Vector<MultiFab*>& a_sol,
                          Location a_loc) const
{
    BL_PROFILE("MLMG::getFluxes()");

    const Real betainv = Real(1.0) / getBScalar();
    const int nlevs = NAMRLevels();
    for (int alev = 0; alev < nlevs; ++alev) {
        compFlux(alev, a_flux[alev], *a_sol[alev], a_loc);
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            unapplyMetricTerm(alev, 0, *a_flux[alev][idim]);
            if (betainv != Real(1.0)) {
                a_flux[alev][idim]->mult(betainv);
            }
        }
    }
}